

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread.cpp
# Opt level: O1

__pid_t __thiscall QThread::wait(QThread *this,void *__stat_loc)

{
  __pointer_type copy;
  QThreadPrivate *this_00;
  __pid_t _Var1;
  undefined8 unaff_RBP;
  long in_FS_OFFSET;
  bool bVar2;
  QMessageLogger local_68;
  QMutex *local_48;
  ulong uStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QThreadPrivate *)(this->super_QObject).d_ptr.d;
  local_48 = &this_00->mutex;
  uStack_40 = 0xaaaaaaaaaaaaaa00;
  if ((this_00->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar2 = (local_48->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar2) {
      (local_48->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (bVar2) goto LAB_003477e7;
  }
  QBasicMutex::lockInternal(&local_48->super_QBasicMutex);
LAB_003477e7:
  uStack_40 = CONCAT71(uStack_40._1_7_,1);
  _Var1 = (__pid_t)CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
  if ((this_00->threadState != NotStarted) && (this_00->threadState != Finished)) {
    if (*(QObjectData **)(in_FS_OFFSET + 0x10) == (this->super_QObject).d_ptr.d[2].q_ptr[5].d_ptr.d)
    {
      local_68.context.version = 2;
      local_68.context._4_8_ = 0;
      local_68.context._12_8_ = 0;
      local_68.context.function._4_4_ = 0;
      local_68.context.category = "default";
      QMessageLogger::warning(&local_68,"QThread::wait: Thread tried to wait on itself");
      _Var1 = 0;
    }
    else {
      _Var1 = QThreadPrivate::wait(this_00,&local_48);
    }
  }
  if ((char)uStack_40 == '\x01') {
    LOCK();
    copy = (local_48->super_QBasicMutex).d_ptr._q_value._M_b._M_p;
    (local_48->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    if (copy != (__pointer_type)0x1) {
      QBasicMutex::unlockInternalFutex(&local_48->super_QBasicMutex,copy);
    }
    uStack_40 = uStack_40 & 0xffffffffffffff00;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return _Var1;
}

Assistant:

bool QThread::wait(QDeadlineTimer deadline)
{
    Q_D(QThread);
    QMutexLocker locker(&d->mutex);

    if (d->threadState == QThreadPrivate::NotStarted || d->threadState == QThreadPrivate::Finished)
        return true;
    if (isCurrentThread()) {
        qWarning("QThread::wait: Thread tried to wait on itself");
        return false;
    }
    return d->wait(locker, deadline);
}